

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>
          (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *this,Box *bx,
          FArrayBox *dest,int dcomp,int numcomp,Geometry *geom,Real time,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int bcomp,int orig_comp,
          FilccCell *fillfunc)

{
  Box *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  double *pdVar9;
  double *pdVar10;
  Real RVar11;
  Real RVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  Real *pRVar27;
  Real *pRVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  IndexType IVar34;
  long lVar35;
  bool bVar36;
  byte bVar37;
  int iVar39;
  undefined1 auVar38 [16];
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  int sm_1;
  int sm;
  Box bx_2;
  Box bx_1;
  Box gdomain;
  Box bx_8;
  uint bitval_1;
  uint bitval;
  int bg;
  Box local_4c8;
  ulong local_4a8;
  ulong local_4a0;
  uint local_498;
  uint local_494;
  ulong local_490;
  long local_488;
  Real local_480;
  int local_478;
  int local_474;
  CoordType local_470;
  uint local_46c;
  uint local_468;
  uint local_464;
  int local_460;
  int local_45c;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  pointer local_440;
  int local_434;
  undefined1 local_430 [72];
  int iStack_3e8;
  uint local_3e4;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint auStack_3d0 [2];
  IndexType IStack_3c8;
  uint local_3c4;
  BCRec *local_3c0;
  uint local_3b8;
  int local_3b4;
  undefined8 local_3b0;
  uint local_3a8;
  Real local_3a4;
  uint local_39c;
  undefined8 local_398;
  uint local_390;
  uint local_38c;
  Real local_388;
  int local_380;
  int local_37c [4];
  long local_36c;
  int local_364;
  undefined8 local_360;
  int iStack_358;
  uint uStack_354;
  Real local_350;
  uint local_348;
  uint local_344;
  uint local_340;
  CoordType local_33c;
  Real local_338;
  int local_330;
  int aiStack_328 [2];
  uint uStack_320;
  int local_31c [3];
  IndexType IStack_310;
  ulong local_300;
  ulong local_2f8;
  long local_2f0;
  int local_2e8 [6];
  uint local_2d0;
  undefined1 local_2c8 [20];
  undefined1 auStack_2b4 [8];
  int iStack_2ac;
  undefined8 local_2a8;
  Dim3 local_2a0;
  undefined8 local_294;
  ulong local_28c;
  int local_284;
  undefined8 local_280;
  uint local_278;
  int iStack_274;
  uint uStack_270;
  int iStack_26c;
  uint auStack_268 [4];
  pointer local_258;
  int local_250;
  undefined1 local_24c [8];
  uint local_244;
  uint local_240;
  ulong local_23c;
  int local_234;
  Real local_230;
  uint local_228;
  uint local_224;
  uint local_220;
  ulong local_21c;
  int local_214;
  ulong local_210;
  uint local_208;
  ulong local_204;
  int local_1fc;
  undefined8 local_1f8;
  int iStack_1f0;
  uint uStack_1ec;
  Real local_1e8;
  uint local_1e0;
  undefined8 local_1dc;
  CoordType local_1d4;
  uint local_1d0;
  int iStack_1cc;
  int local_1c8;
  int local_1c4;
  undefined8 local_1c0;
  uint local_1b8;
  uint local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4 [4];
  undefined8 local_194;
  int local_18c;
  undefined8 local_188;
  int local_180;
  uint local_17c;
  undefined8 local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  double *local_150;
  long local_148;
  long local_140;
  undefined1 local_138 [16];
  Real local_128;
  long local_120;
  Real local_118;
  uint local_10c;
  ulong local_108;
  ulong local_100;
  Box *local_f8;
  long local_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined8 local_98;
  uint local_90;
  Real local_88;
  Real RStack_80;
  Real local_78;
  Real RStack_70;
  Real local_68;
  Real RStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  bVar37 = 0;
  iVar17 = (bx->bigend).vect[0];
  uVar4 = *(undefined8 *)(bx->smallend).vect;
  iVar32 = (int)uVar4;
  iVar21 = (int)((ulong)uVar4 >> 0x20);
  uVar23 = iVar17 - iVar32;
  uVar24 = uVar23 + 1;
  local_4a8 = (ulong)uVar24;
  uVar4 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar31 = (int)uVar4;
  iVar39 = (int)((ulong)uVar4 >> 0x20);
  uVar18 = iVar31 - iVar21;
  uVar19 = uVar18 + 1;
  local_458 = (ulong)uVar19;
  iVar20 = (bx->smallend).vect[2];
  uVar29 = iVar39 - iVar20;
  local_90 = uVar29 + 1;
  local_450 = (ulong)local_90;
  local_98 = CONCAT44(uVar19,uVar24);
  uVar2 = (bx->btype).itype;
  uVar4 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar5 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  uVar6 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  local_31c[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  local_31c[2] = (int)uVar6;
  IStack_310.itype = SUB84(uVar6,4);
  uVar8 = stack0xfffffffffffffcec;
  aiStack_328[0] = (int)uVar4;
  aiStack_328[1] = SUB84(uVar4,4);
  uStack_320 = (uint)uVar5;
  local_31c[0] = (int)((ulong)uVar5 >> 0x20);
  lVar22 = 0;
  IStack_310.itype = SUB84(uVar6,4);
  local_494 = IStack_310.itype;
  unique0x100025aa = uVar8;
  do {
    uVar25 = 1 << ((byte)lVar22 & 0x1f);
    uVar30 = (uint)lVar22;
    local_31c[lVar22] =
         (local_31c[lVar22] + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
         (uint)((local_494 >> (uVar30 & 0x1f) & 1) != 0);
    if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
      local_494 = ~uVar25 & IStack_310.itype;
    }
    else {
      local_494 = uVar25 | IStack_310.itype;
    }
    IStack_310.itype = local_494;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  local_2e8[4] = local_31c[1];
  local_2e8[5] = local_31c[2];
  local_2d0 = local_494;
  local_2e8[0] = (int)uVar4;
  local_2e8[1] = SUB84(uVar4,4);
  local_2e8[2] = uStack_320;
  local_2e8[3] = local_31c[0];
  lVar22 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar22 + 0x19) == '\x01') {
      iVar3 = *(int *)((long)&local_98 + lVar22 * 4);
      local_2e8[lVar22] = local_2e8[lVar22] - iVar3;
      local_2e8[lVar22 + 3] = local_2e8[lVar22 + 3] + iVar3;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  auVar38._0_4_ = -(uint)(local_2e8[4] < iVar31);
  auVar38._4_4_ = -(uint)(local_2e8[5] < iVar39);
  auVar38._8_4_ = -(uint)(iVar32 < local_2e8[0]);
  auVar38._12_4_ = -(uint)(iVar21 < local_2e8[1]);
  iVar32 = movmskps(iVar17,auVar38);
  if (((iVar32 != 0) || (local_2e8[3] < iVar17)) || (iVar20 < local_2e8[2])) {
    local_f8 = bx;
    local_150 = (dest->super_BaseFab<double>).dptr;
    iVar17 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar20 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    local_138._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
    iVar32 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar26 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    local_68 = (geom->prob_domain).xhi[1];
    RStack_60 = (geom->prob_domain).xhi[2];
    local_78 = (geom->prob_domain).xlo[2];
    RStack_70 = (geom->prob_domain).xhi[0];
    local_88 = (geom->prob_domain).xlo[0];
    RStack_80 = (geom->prob_domain).xlo[1];
    uVar4 = *(undefined8 *)(geom->domain).bigend.vect;
    local_58 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_50 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_4c = (undefined4)uVar4;
    uStack_48 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_44 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_e8 = *(undefined4 *)(geom->super_CoordSys).dx;
    uStack_e4 = *(undefined4 *)((long)(geom->super_CoordSys).dx + 4);
    uStack_e0 = *(undefined4 *)((geom->super_CoordSys).dx + 1);
    uStack_dc = *(undefined4 *)((long)(geom->super_CoordSys).dx + 0xc);
    local_128 = (geom->super_CoordSys).dx[2];
    local_464 = (uint)(byte)(geom->super_CoordSys).field_0x51;
    local_468 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    local_46c = (uint)(byte)(geom->super_CoordSys).field_0x53;
    local_470 = (geom->super_CoordSys).c_sys;
    local_440 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_430._0_4_ = local_2e8[0] - uVar24;
    local_448 = CONCAT44(local_2e8[2],local_2e8[1]);
    local_430._4_4_ = local_2e8[1];
    local_430._8_4_ = local_2e8[2];
    local_430._12_4_ = local_2e8[0] + -1;
    lVar35 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_2f0 = (lVar26 - (pBVar1->smallend).vect[0]) + 1;
    local_120 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_148 = (long)iVar32;
    local_488 = (long)bcomp;
    local_3c4 = local_494 & 0xfffffffe;
    local_430._16_4_ = local_2e8[4];
    local_430._20_4_ = local_2e8[5];
    local_430._24_4_ = local_3c4;
    local_490 = (ulong)(uint)local_2e8[2];
    local_158 = CONCAT44(local_2e8[5],local_2e8[4]);
    local_2f8 = (ulong)(uint)local_2e8[5];
    lVar22 = 0;
    do {
      uVar25 = 1 << ((byte)lVar22 & 0x1f);
      uVar30 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0xc) =
           (*(int *)(local_430 + lVar22 * 4 + 0xc) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_430._24_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_430._24_4_ = ~uVar25 & local_430._24_4_;
      }
      else {
        local_430._24_4_ = uVar25 | local_430._24_4_;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar33 = (lVar35 - iVar20) * local_2f0;
    local_434 = local_2e8[1] - uVar19;
    local_478 = local_2e8[1] + -1;
    local_3a8 = local_494 & 0xfffffffd;
    local_430._28_4_ = local_2e8[0];
    local_430._32_4_ = local_434;
    local_430._36_4_ = local_2e8[2];
    local_430._44_4_ = local_478;
    local_430._40_4_ = local_2e8[3];
    local_430._48_4_ = local_2e8[5];
    local_430._52_4_ = local_3a8;
    lVar22 = 0;
    do {
      uVar30 = 1 << ((byte)lVar22 & 0x1f);
      uVar19 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0x28) =
           (*(int *)(local_430 + lVar22 * 4 + 0x28) + (uint)((uVar2 >> (uVar19 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_430._52_4_ >> (uVar19 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar19 & 0x1f) & 1) == 0) {
        local_430._52_4_ = ~uVar30 & local_430._52_4_;
      }
      else {
        local_430._52_4_ = uVar30 | local_430._52_4_;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_4a0 = CONCAT44(local_2e8[1],local_2e8[0]);
    local_480 = (Real)CONCAT44(local_2e8[4],local_2e8[3]);
    iVar20 = local_2e8[2] - local_90;
    uVar19 = local_2e8[2] - 1;
    local_38c = local_494 & 0xfffffffb;
    local_430._56_4_ = local_2e8[0];
    local_430._60_4_ = local_2e8[1];
    local_430._64_4_ = iVar20;
    stack0xfffffffffffffc14 = local_480;
    local_3e4 = uVar19;
    local_3e0 = local_38c;
    lVar22 = 0;
    do {
      uVar25 = 1 << ((byte)lVar22 & 0x1f);
      uVar30 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0x44) =
           (*(int *)(local_430 + lVar22 * 4 + 0x44) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_3e0 >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_3e0 = ~uVar25 & local_3e0;
      }
      else {
        local_3e0 = uVar25 | local_3e0;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_140 = (local_120 - iVar32) * lVar33;
    local_138._8_8_ = lVar35 << 0x20 | lVar26 + 1U & 0xffffffff;
    local_10c = local_494 & 1;
    uStack_3dc = (local_494 & 1 ^ 1) + local_2e8[3];
    local_a0 = (ulong)uVar23;
    local_498 = (uVar24 + uStack_3dc) - 1;
    local_100 = (ulong)uStack_3dc;
    uStack_3d8 = local_2e8[1];
    uStack_3d4 = local_2e8[2];
    auStack_3d0[0] = local_498;
    auStack_3d0[1] = local_2e8[4];
    IStack_3c8.itype = local_2e8[5];
    lVar22 = 0;
    do {
      uVar24 = 1 << ((byte)lVar22 & 0x1f);
      uVar23 = (uint)lVar22;
      auStack_3d0[lVar22] =
           (auStack_3d0[lVar22] + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar24 & local_3c4;
      }
      else {
        local_3c4 = uVar24 | local_3c4;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    bVar36 = (local_494 & 2) == 0;
    local_170 = (ulong)bVar36;
    iVar21 = (uint)bVar36 + local_2e8[4];
    local_300 = (ulong)uVar18;
    local_3c0 = (BCRec *)CONCAT44(iVar21,local_2e8[0]);
    local_3b8 = local_2e8[2];
    local_3b4 = local_2e8[3];
    local_3b0._0_4_ = uVar18 + iVar21;
    local_3b0._4_4_ = local_2e8[5];
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      (&local_3b4)[lVar22] =
           ((&local_3b4)[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3a8 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3a8 = ~uVar23 & local_3a8;
      }
      else {
        local_3a8 = uVar23 | local_3a8;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_178 = CONCAT44(local_178._4_4_,local_494 >> 2) & 0xffffffff00000001;
    local_39c = (local_494 >> 2 & 1 ^ 1) + local_2e8[5];
    local_108 = (ulong)uVar29;
    local_390 = (local_90 + local_39c) - 1;
    local_3a4 = (Real)local_4a0;
    local_d0 = (ulong)local_39c;
    local_398 = local_480;
    local_d8 = (ulong)local_390;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_398 + lVar22 * 4) =
           (*(int *)((long)&local_398 + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_38c >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_38c = ~uVar23 & local_38c;
      }
      else {
        local_38c = uVar23 | local_38c;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_440 = local_440 + local_488;
    lVar22 = 0;
    local_118 = time;
    local_474 = iVar17;
    local_460 = dcomp;
    local_45c = numcomp;
    do {
      uVar16 = uStack_dc;
      uVar15 = uStack_e0;
      uVar14 = uStack_e4;
      uVar13 = local_e8;
      RVar12 = local_118;
      RVar11 = local_128;
      uVar42 = *(ulong *)(local_430 + lVar22);
      uVar7 = *(ulong *)(local_430 + lVar22 + 0xc);
      local_4c8.smallend.vect[2] = (int)*(undefined8 *)(local_430 + lVar22 + 8);
      uVar41 = *(ulong *)(bx->smallend).vect;
      uVar40 = CONCAT44(-(uint)((int)(uVar41 >> 0x20) < (int)(uVar42 >> 0x20)),
                        -(uint)((int)uVar41 < (int)uVar42));
      uVar41 = ~uVar40 & uVar41 | uVar42 & uVar40;
      local_4c8.smallend.vect[0] = (int)uVar41;
      local_4c8.smallend.vect[1] = (int)(uVar41 >> 0x20);
      iVar21 = (bx->smallend).vect[2];
      if (iVar21 < local_4c8.smallend.vect[2]) {
        iVar21 = local_4c8.smallend.vect[2];
      }
      uVar41 = *(ulong *)(bx->bigend).vect;
      uVar42 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar41 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar41));
      uVar41 = ~uVar42 & uVar41 | uVar7 & uVar42;
      local_4c8.bigend.vect[0] = (int)uVar41;
      local_4c8.bigend.vect[1] = (int)(uVar41 >> 0x20);
      local_4c8.bigend.vect[2] = (int)*(undefined8 *)(local_430 + lVar22 + 0x14);
      iVar31 = (bx->bigend).vect[2];
      if (local_4c8.bigend.vect[2] < iVar31) {
        iVar31 = local_4c8.bigend.vect[2];
      }
      local_4c8.btype.itype = (uint)((ulong)*(undefined8 *)(local_430 + lVar22 + 0x14) >> 0x20);
      local_4c8.bigend.vect[2] = iVar31;
      local_2c8._8_4_ = SUB84(local_150,0);
      local_2c8._12_4_ = (undefined4)((ulong)local_150 >> 0x20);
      stack0xfffffffffffffd48 = local_2f0;
      stack0xfffffffffffffd50 = lVar33;
      local_2a8 = local_140;
      local_2a0.x = local_138._0_4_;
      local_2a0.y = local_138._4_4_;
      local_2a0.z = iVar32;
      local_294 = local_138._8_8_;
      local_28c._0_4_ = (int)local_120;
      local_28c._4_4_ = iVar17;
      local_280._4_4_ = local_45c;
      local_280._0_4_ = local_460;
      auStack_268[0] = local_31c[1];
      auStack_268[1] = local_31c[2];
      auStack_268[2] = IStack_310.itype;
      local_278 = aiStack_328[0];
      iStack_274 = aiStack_328[1];
      uStack_270 = uStack_320;
      iStack_26c = local_31c[0];
      local_258 = local_440;
      pRVar27 = &local_88;
      pRVar28 = (Real *)(local_24c + 4);
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        *pRVar28 = *pRVar27;
        pRVar27 = pRVar27 + (ulong)bVar37 * -2 + 1;
        pRVar28 = pRVar28 + (ulong)bVar37 * -2 + 1;
      }
      local_1f8 = (Real)CONCAT44(uVar14,uVar13);
      local_1e0 = local_464;
      local_1dc._4_4_ = local_46c;
      local_1dc._0_4_ = local_468;
      local_1d4 = local_470;
      local_1d0 = SUB84(RVar12,0);
      iStack_1cc = (int)((ulong)RVar12 >> 0x20);
      local_1c8 = orig_comp;
      local_4c8.smallend.vect[2] = iVar21;
      iStack_1f0 = uVar15;
      uStack_1ec = uVar16;
      local_1e8 = RVar11;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_1_>
                (&local_4c8,(anon_class_264_10_7336990c *)local_2c8);
      pBVar1 = local_f8;
      pdVar9 = local_150;
      iVar21 = local_474;
      lVar22 = lVar22 + 0x1c;
    } while (lVar22 != 0xa8);
    local_f0 = lVar33;
    iStack_1cc = (int)local_4a0;
    local_2c8._0_4_ = iStack_1cc - (int)local_4a8;
    local_214 = iStack_1cc + -1;
    auStack_268[3] = local_494 & 0xfffffffc;
    local_4a8 = CONCAT44(local_4a8._4_4_,local_2c8._0_4_);
    local_2c8._4_4_ = local_434;
    local_2c8._8_4_ = (undefined4)local_490;
    local_488 = CONCAT44(local_488._4_4_,local_214);
    local_2c8._12_4_ = local_214;
    IVar34.itype = (uint)local_2f8;
    stack0xfffffffffffffd48 = CONCAT44(IVar34.itype,local_478);
    auStack_2b4._4_4_ = local_494 & 0xfffffffc;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)(auStack_2b4 + lVar22 * 4 + -8) =
           (*(int *)(auStack_2b4 + lVar22 * 4 + -8) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)auStack_2b4._4_4_ >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        auStack_2b4._4_4_ = ~uVar23 & auStack_2b4._4_4_;
      }
      else {
        auStack_2b4._4_4_ = uVar23 | auStack_2b4._4_4_;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    stack0xfffffffffffffd50 = CONCAT44((int)local_100,auStack_2b4._4_4_);
    local_2a8 = CONCAT44(local_2c8._8_4_,local_434);
    local_2a0.y = local_478;
    local_2a0.x = local_498;
    local_2a0.z = IVar34.itype;
    local_294._0_4_ = local_494 & 0xfffffffc;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      (&local_2a0.x)[lVar22] =
           ((&local_2a0.x)[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_294 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_294._0_4_ = ~uVar23 & (uint)local_294;
      }
      else {
        local_294._0_4_ = uVar23 | (uint)local_294;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    iVar17 = (int)(local_494 << 0x1e) >> 0x1f;
    local_a8 = (ulong)(iVar17 + 1);
    uStack_270 = iVar17 + (int)local_158 + 1;
    local_160 = (ulong)uStack_270;
    iVar32 = (int)local_300;
    auStack_268[1] = uStack_270 + iVar32;
    local_168 = (ulong)auStack_268[1];
    local_294._4_4_ = local_2c8._0_4_;
    local_28c = local_448 & 0xffffffff00000000 | (ulong)uStack_270;
    local_284 = local_214;
    local_280 = local_158 & 0xffffffff00000000 | (ulong)auStack_268[1];
    local_278 = local_494 & 0xfffffffc;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      (&local_284)[lVar22] =
           ((&local_284)[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_278 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_278 = ~uVar23 & local_278;
      }
      else {
        local_278 = uVar23 | local_278;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    iStack_274 = (int)local_100;
    iStack_26c = local_2c8._8_4_;
    auStack_268[0] = local_498;
    auStack_268[2] = IVar34.itype;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      auStack_268[lVar22] =
           (auStack_268[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((auStack_268[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        auStack_268[3] = ~uVar23 & auStack_268[3];
      }
      else {
        auStack_268[3] = uVar23 | auStack_268[3];
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uVar41 = local_4a0 & 0xffffffff00000000;
    local_c8 = (ulong)(uint)local_2c8._0_4_;
    local_c0 = (ulong)(iStack_1cc - 1);
    uStack_1ec = local_494 & 0xfffffffa;
    local_258 = (BCRec *)(uVar41 | (uint)local_2c8._0_4_);
    local_250 = iVar20;
    local_24c = (undefined1  [8])((ulong)local_480 & 0xffffffff00000000 | (ulong)(iStack_1cc - 1));
    local_244 = uVar19;
    local_240 = uStack_1ec;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)(local_24c + lVar22 * 4) =
           (*(int *)(local_24c + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_240 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_240 = ~uVar23 & local_240;
      }
      else {
        local_240 = uVar23 | local_240;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_b8 = local_100 & 0xffffffff;
    local_23c = uVar41 | local_100 & 0xffffffff;
    local_b0 = (ulong)local_498;
    local_1f8 = (Real)((ulong)local_480 & 0xffffffff00000000 | (ulong)local_498);
    local_234 = iVar20;
    local_230 = local_1f8;
    local_228 = uVar19;
    local_224 = uStack_1ec;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_230 + lVar22 * 4) =
           (*(int *)((long)&local_230 + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_224 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_224 = ~uVar23 & local_224;
      }
      else {
        local_224 = uVar23 | local_224;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_220 = local_2c8._0_4_;
    local_21c = local_448 & 0xffffffff | local_d0 << 0x20;
    local_210 = local_158 & 0xffffffff | local_d8 << 0x20;
    local_208 = uStack_1ec;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      (&local_214)[lVar22] =
           ((&local_214)[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_208 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_208 = ~uVar23 & local_208;
      }
      else {
        local_208 = uVar23 | local_208;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_1fc = (IVar34.itype + 1) - (int)local_178;
    iVar31 = (int)local_450;
    local_204 = local_23c;
    iStack_1f0 = iVar31 + local_1fc + -1;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_1f8 + lVar22 * 4) =
           (*(int *)((long)&local_1f8 + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((uStack_1ec >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        uStack_1ec = ~uVar23 & uStack_1ec;
      }
      else {
        uStack_1ec = uVar23 | uStack_1ec;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uVar18 = (int)(local_4a0 >> 0x20) - (int)local_458;
    local_178 = (ulong)uVar18 << 0x20;
    local_458 = uVar41 - 0x100000000;
    local_17c = local_494 & 0xfffffff9;
    local_1e8 = (Real)CONCAT44(uVar18,iStack_1cc);
    local_1e0 = iVar20;
    local_1dc = local_458 | (ulong)local_480 & 0xffffffff;
    local_1d4 = uVar19;
    local_1d0 = local_17c;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_1dc + lVar22 * 4) =
           (*(int *)((long)&local_1dc + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_1d0 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1d0 = ~uVar23 & local_1d0;
      }
      else {
        local_1d0 = uVar23 | local_1d0;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_490._0_4_ = (int)((ulong)local_480 >> 0x20);
    local_1c8 = (int)local_170 + (int)local_490;
    local_1c4 = iVar20;
    local_1c0 = CONCAT44(iVar32 + local_1c8,local_480._0_4_);
    local_1b8 = uVar19;
    local_1b4 = local_17c;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_1c0 + lVar22 * 4) =
           (*(int *)((long)&local_1c0 + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_1b4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1b4 = ~uVar23 & local_1b4;
      }
      else {
        local_1b4 = uVar23 | local_1b4;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uVar18 = (int)(local_494 << 0x1d) >> 0x1f;
    local_450 = (ulong)uVar18;
    local_1a8 = IVar34.itype + 1 + uVar18;
    local_1b0 = iStack_1cc;
    local_1ac = local_434;
    local_1a4[0] = local_480._0_4_;
    local_1a4[1] = local_478;
    local_1a4[2] = iVar31 + IVar34.itype + uVar18;
    local_1a4[3] = local_17c;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      local_1a4[lVar22] =
           (local_1a4[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_1a4[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_1a4[3] = ~uVar23 & local_1a4[3];
      }
      else {
        local_1a4[3] = uVar23 | local_1a4[3];
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uVar23 = (int)local_490 + iVar17 + 1;
    uVar18 = iVar32 + (int)local_490 + iVar17 + 1;
    local_4a0 = (ulong)uVar23 << 0x20;
    local_170 = (ulong)uVar18 << 0x20;
    local_194 = CONCAT44(uVar23,iStack_1cc);
    local_18c = local_1a8;
    local_188 = CONCAT44(uVar18,local_480._0_4_);
    local_180 = (int)local_108 + local_1a8;
    lVar22 = 0;
    do {
      uVar18 = 1 << ((byte)lVar22 & 0x1f);
      uVar23 = (uint)lVar22;
      *(uint *)((long)&local_188 + lVar22 * 4) =
           (*(int *)((long)&local_188 + lVar22 * 4) + (uint)((uVar2 >> (uVar23 & 0x1f) & 1) != 0)) -
           (uint)((local_17c >> (uVar23 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar23 & 0x1f) & 1) == 0) {
        local_17c = ~uVar18 & local_17c;
      }
      else {
        local_17c = uVar18 | local_17c;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    local_490 = (ulong)local_480 >> 0x20;
    do {
      uVar16 = uStack_dc;
      uVar15 = uStack_e0;
      uVar14 = uStack_e4;
      uVar13 = local_e8;
      RVar12 = local_118;
      RVar11 = local_128;
      uVar42 = *(ulong *)(local_2c8 + lVar22);
      uVar7 = *(ulong *)(local_2c8 + lVar22 + 0xc);
      local_4c8.smallend.vect[2] = (int)*(undefined8 *)(local_2c8 + lVar22 + 8);
      uVar41 = *(ulong *)(pBVar1->smallend).vect;
      uVar40 = CONCAT44(-(uint)((int)(uVar41 >> 0x20) < (int)(uVar42 >> 0x20)),
                        -(uint)((int)uVar41 < (int)uVar42));
      uVar41 = ~uVar40 & uVar41 | uVar42 & uVar40;
      local_4c8.smallend.vect[0] = (int)uVar41;
      local_4c8.smallend.vect[1] = (int)(uVar41 >> 0x20);
      iVar17 = (pBVar1->smallend).vect[2];
      if (iVar17 < local_4c8.smallend.vect[2]) {
        iVar17 = local_4c8.smallend.vect[2];
      }
      uVar41 = *(ulong *)(pBVar1->bigend).vect;
      uVar42 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar41 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar41));
      uVar41 = ~uVar42 & uVar41 | uVar7 & uVar42;
      local_4c8.bigend.vect[0] = (int)uVar41;
      local_4c8.bigend.vect[1] = (int)(uVar41 >> 0x20);
      local_4c8.bigend.vect[2] = (int)*(undefined8 *)(auStack_2b4 + lVar22);
      iVar32 = (pBVar1->bigend).vect[2];
      if (local_4c8.bigend.vect[2] < iVar32) {
        iVar32 = local_4c8.bigend.vect[2];
      }
      local_4c8.btype.itype = (uint)((ulong)*(undefined8 *)(auStack_2b4 + lVar22) >> 0x20);
      local_4c8.bigend.vect[2] = iVar32;
      local_430._8_4_ = SUB84(pdVar9,0);
      local_430._12_4_ = (undefined4)((ulong)pdVar9 >> 0x20);
      local_430._16_4_ = (undefined4)local_2f0;
      local_430._20_4_ = (undefined4)((ulong)local_2f0 >> 0x20);
      local_430._24_4_ = (undefined4)lVar33;
      local_430._28_4_ = (undefined4)((ulong)lVar33 >> 0x20);
      local_430._32_4_ = (undefined4)local_140;
      local_430._36_4_ = (undefined4)((ulong)local_140 >> 0x20);
      local_430._40_8_ = local_138._0_8_;
      local_430._48_4_ = (int)local_148;
      local_430._52_4_ = (undefined4)local_138._8_8_;
      local_430._56_4_ = SUB84(local_138._8_8_,4);
      local_430._60_4_ = (int)local_120;
      local_430._64_4_ = iVar21;
      stack0xfffffffffffffc14 = (Real)CONCAT44(local_460,local_430._68_4_);
      local_3e4 = local_45c;
      auStack_3d0[0] = local_31c[1];
      auStack_3d0[1] = (uint)stack0xfffffffffffffcec;
      IStack_3c8.itype = SUB84(stack0xfffffffffffffcec,4);
      local_3e0 = aiStack_328[0];
      uStack_3dc = aiStack_328[1];
      uStack_3d8 = uStack_320;
      uStack_3d4 = local_31c[0];
      local_3c0 = local_440;
      pRVar27 = &local_88;
      pRVar28 = (Real *)&local_3b0;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        *pRVar28 = *pRVar27;
        pRVar27 = pRVar27 + (ulong)bVar37 * -2 + 1;
        pRVar28 = pRVar28 + (ulong)bVar37 * -2 + 1;
      }
      local_360 = (Real)CONCAT44(uVar14,uVar13);
      local_348 = local_464;
      local_344 = local_468;
      local_340 = local_46c;
      local_33c = local_470;
      local_330 = orig_comp;
      local_4c8.smallend.vect[2] = iVar17;
      iStack_358 = uVar15;
      uStack_354 = uVar16;
      local_350 = RVar11;
      local_338 = RVar12;
      local_430._24_8_ = lVar33;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_2_>
                (&local_4c8,(anon_class_264_10_7336990c *)local_430);
      lVar26 = local_f0;
      pdVar10 = local_150;
      iVar17 = local_474;
      lVar22 = lVar22 + 0x1c;
    } while (lVar22 != 0x150);
    uStack_354 = local_494 & 0xfffffff8;
    local_430._0_4_ = (undefined4)(local_c8 | local_178);
    local_430._4_4_ = (undefined4)((local_c8 | local_178) >> 0x20);
    local_430._8_4_ = iVar20;
    local_430._12_4_ = (undefined4)(local_c0 | local_458);
    local_430._16_4_ = (undefined4)((local_c0 | local_458) >> 0x20);
    local_430._20_4_ = uVar19;
    local_430._24_4_ = uStack_354;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0xc) =
           (*(int *)(local_430 + lVar22 * 4 + 0xc) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_430._24_4_ >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_430._24_4_ = ~uVar23 & local_430._24_4_;
      }
      else {
        local_430._24_4_ = uVar23 | local_430._24_4_;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    iVar32 = SUB84(local_480,0) - local_10c;
    uStack_3dc = iVar32 + 1;
    auStack_3d0[0] = (int)local_a0 + iVar32 + 1;
    local_430._28_4_ = (uint)local_178 | uStack_3dc;
    local_430._32_4_ = (undefined4)(local_178 >> 0x20);
    local_430._36_4_ = iVar20;
    local_430._40_8_ = local_458 | auStack_3d0[0];
    local_430._48_4_ = uVar19;
    local_430._52_4_ = uStack_354;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0x28) =
           (*(int *)(local_430 + lVar22 * 4 + 0x28) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_430._52_4_ >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_430._52_4_ = ~uVar23 & local_430._52_4_;
      }
      else {
        local_430._52_4_ = uVar23 | local_430._52_4_;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_2c8._0_4_ = (int)local_4a8;
    local_2c8._8_4_ = (undefined4)(local_448 >> 0x20);
    local_2c8._4_4_ = (undefined4)local_160;
    local_430._56_4_ = (int)local_4a8;
    local_430._60_4_ = local_2c8._4_4_;
    local_430._64_4_ = iVar20;
    local_430._68_4_ = (int)local_488;
    iStack_3e8 = (int)local_168;
    local_3e4 = uVar19;
    local_3e0 = uStack_354;
    lVar22 = 0;
    do {
      uVar23 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)(local_430 + lVar22 * 4 + 0x44) =
           (*(int *)(local_430 + lVar22 * 4 + 0x44) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3e0 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3e0 = ~uVar23 & local_3e0;
      }
      else {
        local_3e0 = uVar23 | local_3e0;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uStack_3dc = (uint)local_4a0 | uStack_3dc;
    auStack_3d0[0] = (uint)local_170 | auStack_3d0[0];
    uStack_3d8 = (uint)(local_4a0 >> 0x20);
    uStack_3d4 = iVar20;
    auStack_3d0[1] = (uint)(local_170 >> 0x20);
    IStack_3c8.itype = uVar19;
    local_3c4 = uStack_354;
    lVar22 = 0;
    do {
      uVar19 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      auStack_3d0[lVar22] =
           (auStack_3d0[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar19 & local_3c4;
      }
      else {
        local_3c4 = uVar19 | local_3c4;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_3b8 = (int)local_450 + (int)local_2f8 + 1;
    iStack_358 = (int)local_108 + 1 + (int)local_450 + (int)local_2f8;
    local_3c0 = (BCRec *)CONCAT44(local_434,(int)local_4a8);
    local_3b4 = (int)local_488;
    local_3b0._0_4_ = local_478;
    local_3b0._4_4_ = iStack_358;
    local_3a8 = uStack_354;
    lVar22 = 0;
    do {
      uVar19 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      (&local_3b4)[lVar22] =
           ((&local_3b4)[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_3a8 >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_3a8 = ~uVar19 & local_3a8;
      }
      else {
        local_3a8 = uVar19 | local_3a8;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_3a4._4_4_ = local_434;
    local_3a4._0_4_ = (int)local_100;
    local_39c = local_3b8;
    local_398 = (Real)CONCAT44(local_478,local_498);
    local_390 = iStack_358;
    local_38c = uStack_354;
    lVar22 = 0;
    do {
      uVar19 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      *(uint *)((long)&local_398 + lVar22 * 4) =
           (*(int *)((long)&local_398 + lVar22 * 4) + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)((local_38c >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_38c = ~uVar19 & local_38c;
      }
      else {
        local_38c = uVar19 | local_38c;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    local_388 = (Real)CONCAT44(local_2c8._4_4_,(int)local_4a8);
    local_380 = local_3b8;
    local_37c[0] = (int)local_488;
    local_37c[1] = (int)local_168;
    local_37c[2] = iStack_358;
    local_37c[3] = uStack_354;
    lVar22 = 0;
    do {
      uVar19 = 1 << ((byte)lVar22 & 0x1f);
      uVar18 = (uint)lVar22;
      local_37c[lVar22] =
           (local_37c[lVar22] + (uint)((uVar2 >> (uVar18 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_37c[3] >> (uVar18 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar18 & 0x1f) & 1) == 0) {
        local_37c[3] = ~uVar19 & local_37c[3];
      }
      else {
        local_37c[3] = uVar19 | local_37c[3];
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    uVar18 = (int)local_a8 + (int)local_490;
    local_36c = ((ulong)uVar18 << 0x20) + local_b8;
    local_364 = local_3b8;
    local_360 = (Real)(((ulong)((int)local_300 + uVar18) << 0x20) + local_b0);
    lVar22 = 0;
    do {
      uVar18 = 1 << ((byte)lVar22 & 0x1f);
      uVar19 = (uint)lVar22;
      *(uint *)((long)&local_360 + lVar22 * 4) =
           (*(int *)((long)&local_360 + lVar22 * 4) + (uint)((uVar2 >> (uVar19 & 0x1f) & 1) != 0)) -
           (uint)((uStack_354 >> (uVar19 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar19 & 0x1f) & 1) == 0) {
        uStack_354 = ~uVar18 & uStack_354;
      }
      else {
        uStack_354 = uVar18 | uStack_354;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      uStack_1ec = uStack_dc;
      iStack_1f0 = uStack_e0;
      uVar14 = uStack_e4;
      uVar13 = local_e8;
      RVar11 = local_118;
      local_1e8 = local_128;
      uVar42 = *(ulong *)(local_430 + lVar22);
      uVar7 = *(ulong *)(local_430 + lVar22 + 0xc);
      local_4c8.smallend.vect[2] = (int)*(undefined8 *)(local_430 + lVar22 + 8);
      uVar41 = *(ulong *)(pBVar1->smallend).vect;
      uVar40 = CONCAT44(-(uint)((int)(uVar41 >> 0x20) < (int)(uVar42 >> 0x20)),
                        -(uint)((int)uVar41 < (int)uVar42));
      uVar41 = ~uVar40 & uVar41 | uVar42 & uVar40;
      local_4c8.smallend.vect[0] = (int)uVar41;
      local_4c8.smallend.vect[1] = (int)(uVar41 >> 0x20);
      iVar20 = (pBVar1->smallend).vect[2];
      if (iVar20 < local_4c8.smallend.vect[2]) {
        iVar20 = local_4c8.smallend.vect[2];
      }
      uVar41 = *(ulong *)(pBVar1->bigend).vect;
      uVar42 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar41 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar41));
      uVar41 = ~uVar42 & uVar41 | uVar7 & uVar42;
      local_4c8.bigend.vect[0] = (int)uVar41;
      local_4c8.bigend.vect[1] = (int)(uVar41 >> 0x20);
      local_4c8.bigend.vect[2] = (int)*(undefined8 *)(local_430 + lVar22 + 0x14);
      iVar32 = (pBVar1->bigend).vect[2];
      if (local_4c8.bigend.vect[2] < iVar32) {
        iVar32 = local_4c8.bigend.vect[2];
      }
      local_4c8.btype.itype = (uint)((ulong)*(undefined8 *)(local_430 + lVar22 + 0x14) >> 0x20);
      local_4c8.bigend.vect[2] = iVar32;
      local_2c8._8_4_ = SUB84(pdVar10,0);
      local_2c8._12_4_ = (undefined4)((ulong)pdVar10 >> 0x20);
      stack0xfffffffffffffd48 = local_2f0;
      stack0xfffffffffffffd50 = lVar26;
      local_2a8 = local_140;
      local_2a0.x = local_138._0_4_;
      local_2a0.y = local_138._4_4_;
      local_2a0.z = (int)local_148;
      local_294 = local_138._8_8_;
      local_28c._0_4_ = (int)local_120;
      local_28c._4_4_ = iVar17;
      local_280._4_4_ = local_45c;
      local_280._0_4_ = local_460;
      auStack_268[0] = local_31c[1];
      auStack_268[1] = local_31c[2];
      auStack_268[2] = IStack_310.itype;
      local_278 = aiStack_328[0];
      iStack_274 = aiStack_328[1];
      uStack_270 = uStack_320;
      iStack_26c = local_31c[0];
      local_258 = local_440;
      pRVar27 = &local_88;
      pRVar28 = (Real *)(local_24c + 4);
      for (lVar35 = 10; lVar35 != 0; lVar35 = lVar35 + -1) {
        *pRVar28 = *pRVar27;
        pRVar27 = pRVar27 + (ulong)bVar37 * -2 + 1;
        pRVar28 = pRVar28 + (ulong)bVar37 * -2 + 1;
      }
      local_1f8 = (Real)CONCAT44(uVar14,uVar13);
      local_1e0 = local_464;
      local_1dc._4_4_ = local_46c;
      local_1dc._0_4_ = local_468;
      local_1d4 = local_470;
      local_1d0 = SUB84(RVar11,0);
      iStack_1cc = (int)((ulong)RVar11 >> 0x20);
      local_1c8 = orig_comp;
      local_4c8.smallend.vect[2] = iVar20;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_3_>
                (&local_4c8,(anon_class_264_10_7336990c *)local_2c8);
      lVar22 = lVar22 + 0x1c;
    } while (lVar22 != 0xe0);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}